

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmCTest *pcVar4;
  undefined8 uVar5;
  int iVar6;
  cmCTestBuildHandler *pcVar7;
  cmValue cVar8;
  cmValue cVar9;
  string *native;
  string *target;
  cmake *gname;
  cmGlobalGenerator *pcVar10;
  ostream *poVar11;
  bool bVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string buildCommand;
  string cmakeBuildConfiguration;
  string dir;
  ostringstream cmCTestLog_msg;
  string local_240;
  string local_220;
  string *local_200;
  string local_1f8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [360];
  _Base_ptr local_50;
  long local_40;
  
  pcVar7 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar7->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar7);
  this->Handler = pcVar7;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1c8._0_8_ = (cmGlobalGenerator *)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_BUILD_COMMAND","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_1c8);
  if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
    goto LAB_005b48e2;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1c8._0_8_ = (cmGlobalGenerator *)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_CMAKE_GENERATOR","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_1c8);
  if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1c8._0_8_ = (cmGlobalGenerator *)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CTEST_BUILD_CONFIGURATION","");
  cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)local_1c8);
  if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if ((this->Configuration)._M_string_length == 0) {
    if ((cVar9.Value == (string *)0x0) || ((cVar9.Value)->_M_string_length == 0)) {
      cVar9.Value = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
  }
  else {
    cVar9.Value = &this->Configuration;
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
  if ((this->Flags)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1c8._0_8_ = (cmGlobalGenerator *)local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_BUILD_FLAGS","");
    native = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_1c8);
    if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)local_1b8) {
      operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
    }
  }
  else {
    native = &this->Flags;
  }
  if ((this->Target)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1c8._0_8_ = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_BUILD_TARGET","");
    target = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_1c8);
    if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)local_1b8) {
      operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
    }
  }
  else {
    target = &this->Target;
  }
  if ((cVar8.Value == (string *)0x0) || ((cVar8.Value)->_M_string_length == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
               ,0xbf);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x60));
    goto LAB_005b45e4;
  }
  if (local_220._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_220,0,(char *)0x0,0x7dba6c);
  }
  pcVar3 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (pcVar3 == (cmGlobalGenerator *)0x0) {
LAB_005b466f:
    gname = cmMakefile::GetCMakeInstance
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmake::CreateGlobalGenerator((cmake *)local_1c8,(string *)gname,SUB81(cVar8.Value,0));
    pcVar10 = (cmGlobalGenerator *)local_1c8._0_8_;
    local_1c8._0_8_ = (cmGlobalGenerator *)0x0;
    pcVar3 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    (this->GlobalGenerator)._M_t.
    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = pcVar10;
    if (pcVar3 != (cmGlobalGenerator *)0x0) {
      (*pcVar3->_vptr_cmGlobalGenerator[1])();
      if ((cmGlobalGenerator *)local_1c8._0_8_ != (cmGlobalGenerator *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      pcVar10 = (this->GlobalGenerator)._M_t.
                super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    }
    if (pcVar10 == (cmGlobalGenerator *)0x0) {
      local_1b8._8_8_ = ((cVar8.Value)->_M_dataplus)._M_p;
      local_1b8._0_8_ = (cVar8.Value)->_M_string_length;
      local_1c8._0_8_ = (cmGlobalGenerator *)0x22;
      local_1c8._8_8_ = "could not create generator named \"";
      local_1f8._M_string_length = (size_type)&local_1f8.field_2;
      local_1f8._M_dataplus._M_p = (pointer)0x1;
      local_1f8.field_2._M_local_buf[0] = '\"';
      local_1b8._16_8_ = (pointer)0x1;
      views._M_len = 3;
      views._M_array = (iterator)local_1c8;
      local_1b8._24_8_ = local_1f8._M_string_length;
      cmCatViews_abi_cxx11_(&local_240,views);
      cmMakefile::IssueMessage
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile,
                 FATAL_ERROR,&local_240);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
LAB_005b45e4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      return (cmCTestGenericHandler *)0x0;
    }
  }
  else {
    (*pcVar3->_vptr_cmGlobalGenerator[3])(local_1c8);
    uVar5 = local_1c8._0_8_;
    local_200 = target;
    if ((pointer)local_1c8._8_8_ == (pointer)(cVar8.Value)->_M_string_length) {
      if ((pointer)local_1c8._8_8_ == (pointer)0x0) {
        bVar12 = false;
      }
      else {
        iVar6 = bcmp((void *)local_1c8._0_8_,((cVar8.Value)->_M_dataplus)._M_p,local_1c8._8_8_);
        bVar12 = iVar6 != 0;
      }
    }
    else {
      bVar12 = true;
    }
    if ((cmGlobalGenerator *)uVar5 != (cmGlobalGenerator *)local_1b8) {
      operator_delete((void *)uVar5,local_1b8._0_8_ + 1);
    }
    target = local_200;
    if (bVar12) {
      pcVar3 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
      if (pcVar3 == (cmGlobalGenerator *)0x0) goto LAB_005b466f;
      (*pcVar3->_vptr_cmGlobalGenerator[1])();
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    goto LAB_005b466f;
  }
  if (local_220._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_220,0,(char *)0x0,0x7aae8d);
  }
  pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_1f8,pcVar4,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  pcVar3 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  bVar12 = cmMakefile::IgnoreErrorsCMP0061
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                      Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            (&local_240,pcVar3,target,&local_220,&this->ParallelLevel,native,bVar12);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"SetMakeCommand:",0xf);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
               ,0x6a,(char *)local_50,(this->super_cmCTestHandlerCommand).Quiet);
  if (local_50 != (_Base_ptr)&local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x60));
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",&local_240
             ,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
LAB_005b48e2:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_USE_LAUNCHERS","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
               cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CTEST_LABELS_FOR_SUBPROJECTS","");
  cVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar7->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar7->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
#ifdef CMAKE_INTDIR
        cmakeBuildConfiguration = CMAKE_INTDIR;
#else
        cmakeBuildConfiguration = "Debug";
#endif
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}